

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall google::protobuf::TextFormat::Parser::ParserImpl::SkipFieldMessage(ParserImpl *this)

{
  bool bVar1;
  int iVar2;
  AlphaNum *in_R8;
  byte local_1a1;
  allocator<char> local_159;
  string local_158;
  allocator<char> local_131;
  string local_130;
  undefined4 local_10c;
  undefined1 local_108 [8];
  string delimiter;
  AlphaNum local_d8;
  AlphaNum local_a8;
  AlphaNum local_78;
  string local_48;
  string_view local_28;
  ParserImpl *local_18;
  ParserImpl *this_local;
  
  iVar2 = this->recursion_limit_ + -1;
  this->recursion_limit_ = iVar2;
  local_18 = this;
  if (iVar2 < 0) {
    absl::lts_20250127::AlphaNum::AlphaNum
              (&local_78,
               "Message is too deep, the parser exceeded the configured recursion limit of ");
    absl::lts_20250127::AlphaNum::AlphaNum(&local_a8,this->initial_recursion_limit_);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_d8,".");
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_48,(lts_20250127 *)&local_78,&local_a8,&local_d8,in_R8);
    local_28 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_48);
    ReportError(this,local_28);
    std::__cxx11::string::~string((string *)&local_48);
    this_local._7_1_ = 0;
  }
  else {
    std::__cxx11::string::string((string *)local_108);
    bVar1 = ConsumeMessageDelimiter(this,(string *)local_108);
    if (bVar1) {
      do {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,">",&local_131);
        bVar1 = LookingAt(this,&local_130);
        local_1a1 = 0;
        if (!bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"}",&local_159);
          bVar1 = LookingAt(this,&local_158);
          local_1a1 = bVar1 ^ 0xff;
          std::__cxx11::string::~string((string *)&local_158);
          std::allocator<char>::~allocator(&local_159);
        }
        std::__cxx11::string::~string((string *)&local_130);
        std::allocator<char>::~allocator(&local_131);
        if ((local_1a1 & 1) == 0) {
          bVar1 = Consume(this,(string *)local_108);
          if (bVar1) {
            this->recursion_limit_ = this->recursion_limit_ + 1;
            this_local._7_1_ = 1;
          }
          else {
            this_local._7_1_ = 0;
          }
          goto LAB_00593952;
        }
        bVar1 = SkipField(this);
      } while (bVar1);
      this_local._7_1_ = 0;
    }
    else {
      this_local._7_1_ = 0;
    }
LAB_00593952:
    local_10c = 1;
    std::__cxx11::string::~string((string *)local_108);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool SkipFieldMessage() {
    if (--recursion_limit_ < 0) {
      ReportError(
          absl::StrCat("Message is too deep, the parser exceeded the "
                       "configured recursion limit of ",
                       initial_recursion_limit_, "."));
      return false;
    }

    std::string delimiter;
    DO(ConsumeMessageDelimiter(&delimiter));
    while (!LookingAt(">") && !LookingAt("}")) {
      DO(SkipField());
    }
    DO(Consume(delimiter));

    ++recursion_limit_;
    return true;
  }